

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ResultBuilder::captureExpectedException
          (ResultBuilder *this,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *matcher)

{
  OfType *this_00;
  int iVar1;
  undefined1 local_140 [8];
  AssertionResult result;
  AssertionResultData data;
  string actualMessage;
  
  if ((this->m_exprComponents).testFalse == false) {
    this_00 = &result.m_resultData.resultType;
    AssertionResultData::AssertionResultData((AssertionResultData *)this_00,&this->m_data);
    data.message.field_2._8_4_ = 0;
    std::__cxx11::string::_M_assign((string *)this_00);
    translateActiveException_abi_cxx11_();
    iVar1 = (*(matcher->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[5])(matcher,&data.resultType);
    if ((char)iVar1 == '\0') {
      data.message.field_2._8_4_ = 0x11;
      std::__cxx11::string::_M_assign((string *)&result.m_resultData.resultType);
    }
    AssertionResult::AssertionResult
              ((AssertionResult *)local_140,&this->m_assertionInfo,
               (AssertionResultData *)&result.m_resultData.resultType);
    handleResult(this,(AssertionResult *)local_140);
    AssertionResult::~AssertionResult((AssertionResult *)local_140);
    std::__cxx11::string::~string((string *)&data.resultType);
    AssertionResultData::~AssertionResultData
              ((AssertionResultData *)&result.m_resultData.resultType);
    return;
  }
  __assert_fail("m_exprComponents.testFalse == false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/tests/catch.hpp"
                ,0x2062,
                "void Catch::ResultBuilder::captureExpectedException(const Matchers::Impl::Matcher<std::string> &)"
               );
}

Assistant:

void ResultBuilder::captureExpectedException(Matchers::Impl::Matcher<std::string> const& matcher) {

		assert(m_exprComponents.testFalse == false);
		AssertionResultData data = m_data;
		data.resultType = ResultWas::Ok;
		data.reconstructedExpression = m_assertionInfo.capturedExpression;

		std::string actualMessage = Catch::translateActiveException();
		if (!matcher.match(actualMessage)) {
			data.resultType = ResultWas::ExpressionFailed;
			data.reconstructedExpression = actualMessage;
		}
		AssertionResult result(m_assertionInfo, data);
		handleResult(result);
	}